

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

void it_pickup_stop_at_end(DUMB_RESAMPLER *resampler,void *data)

{
  bool bVar1;
  
  bVar1 = resampler->dir < 0;
  if (bVar1) {
    resampler->pos = ~resampler->pos + resampler->start * 2;
    resampler->subpos = resampler->subpos ^ 0xffff;
  }
  resampler->dir = (uint)bVar1;
  return;
}

Assistant:

static void it_pickup_stop_at_end(DUMB_RESAMPLER *resampler, void *data)
{
	(void)data;

	if (resampler->dir < 0) {
		resampler->pos = (resampler->start << 1) - 1 - resampler->pos;
		resampler->subpos ^= 65535;
		/* By rights, time_lost would be updated here. However, there is no
		 * need at this point; it will not be used.
		 *
		 * ((IT_PLAYING *)data)->time_lost += (resampler->src_end - resampler->src_start) << 1;
		 */
		resampler->dir = 1;
	} else
		resampler->dir = 0;
}